

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_finalize(wally_psbt *psbt)

{
  wally_psbt_input *input;
  wally_psbt_input *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx *pwVar3;
  wally_map_item *pwVar4;
  uchar *bytes;
  size_t sVar5;
  wally_map *pwVar6;
  _Bool _Var7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  uchar *puVar11;
  size_t in_RSI;
  uchar *bytes_00;
  ulong uVar12;
  size_t local_4b0;
  size_t opcode_size;
  size_t threshold;
  size_t n_pubkeys;
  wally_tx_witness_stack **local_478;
  uchar *local_470;
  wally_map *local_468;
  uchar *local_460;
  char local_458;
  undefined7 uStack_457;
  size_t type;
  size_t sig_index;
  size_t found_pubkey_len;
  uint32_t sighashes [15];
  uchar script [140];
  
  iVar8 = -2;
  if (((psbt != (wally_psbt *)0x0) && (psbt->tx != (wally_tx *)0x0)) &&
     (uVar9 = psbt->tx->num_inputs, uVar9 == psbt->num_inputs)) {
    for (uVar12 = 0; uVar12 < uVar9; uVar12 = uVar12 + 1) {
      pwVar1 = psbt->inputs;
      if ((pwVar1[uVar12].final_scriptsig == (uchar *)0x0) &&
         (input = pwVar1 + uVar12, input->final_witness == (wally_tx_witness_stack *)0x0)) {
        uVar9 = (ulong)psbt->tx->inputs[uVar12].index;
        pwVar2 = input->witness_utxo;
        if ((pwVar2 == (wally_tx_output *)0x0) || (pwVar2->script_len == 0)) {
          pwVar3 = input->utxo;
          if ((pwVar3 == (wally_tx *)0x0) || (pwVar3->num_outputs <= uVar9)) {
            bytes_00 = (uchar *)0x0;
          }
          else {
            bytes_00 = pwVar3->outputs[uVar9].script;
            in_RSI = pwVar3->outputs[uVar9].script_len;
          }
          local_458 = '\0';
          uStack_457 = 0;
        }
        else {
          bytes_00 = pwVar2->script;
          uStack_457 = (undefined7)((ulong)pwVar2 >> 8);
          local_458 = '\x01';
          in_RSI = pwVar2->script_len;
        }
        local_460 = input->redeem_script;
        if (local_460 != (uchar *)0x0) {
          in_RSI = input->redeem_script_len;
          bytes_00 = local_460;
        }
        if (input->witness_script == (uchar *)0x0) {
          if (bytes_00 == (uchar *)0x0) goto LAB_003dc6a5;
        }
        else {
          in_RSI = input->witness_script_len;
          local_458 = '\x01';
          bytes_00 = input->witness_script;
        }
        iVar8 = wally_scriptpubkey_get_type(bytes_00,in_RSI,&type);
        if (iVar8 == 0) {
          if (type == 0x20) {
            local_478 = &input->final_witness;
            _Var7 = script_is_op_n(*bytes_00,false,&threshold);
            if ((_Var7) && (threshold <= (input->signatures).num_items)) {
              _Var7 = script_is_op_n((bytes_00 + in_RSI)[-2],false,&n_pubkeys);
              if (n_pubkeys < 0x10 && _Var7) {
                local_468 = &input->signatures;
                uVar9 = 0;
                local_4b0 = 0;
                local_470 = bytes_00 + in_RSI;
                for (puVar11 = bytes_00 + 1; (uVar9 < n_pubkeys && (puVar11 < local_470));
                    puVar11 = puVar11 + sVar10) {
                  sVar10 = (long)local_470 - (long)puVar11;
                  iVar8 = script_get_push_size_from_bytes(puVar11,sVar10,&found_pubkey_len);
                  if ((iVar8 != 0) ||
                     (iVar8 = script_get_push_opcode_size_from_bytes(puVar11,sVar10,&opcode_size),
                     sVar10 = found_pubkey_len, pwVar6 = local_468, iVar8 != 0)) goto LAB_003dca57;
                  puVar11 = puVar11 + opcode_size;
                  iVar8 = wally_map_find(local_468,puVar11,found_pubkey_len,&sig_index);
                  if (sig_index != 0 && iVar8 == 0) {
                    bytes = pwVar6->items[sig_index - 1].value;
                    sVar5 = pwVar6->items[sig_index - 1].value_len;
                    sighashes[local_4b0] = (uint)bytes[sVar5 - 1];
                    iVar8 = wally_ec_sig_from_der(bytes,sVar5 - 1,script + local_4b0 * 0x40,0x40);
                    if ((iVar8 == 0) && (local_4b0 = local_4b0 + 1, local_4b0 == threshold))
                    goto LAB_003dc998;
                  }
                  uVar9 = uVar9 + 1;
                }
                if (local_4b0 == threshold) {
LAB_003dc998:
                  if (local_458 == '\0') {
                    sVar10 = local_4b0 * 0x4a + in_RSI;
                    puVar11 = (uchar *)wally_malloc(sVar10);
                    if ((puVar11 != (uchar *)0x0) &&
                       (iVar8 = wally_scriptsig_multisig_from_bytes
                                          (bytes_00,in_RSI,script,local_4b0 << 6,sighashes,local_4b0
                                           ,0,puVar11,sVar10,&opcode_size), iVar8 == 0)) {
                      input->final_scriptsig = puVar11;
                      input->final_scriptsig_len = opcode_size;
                      goto LAB_003dca86;
                    }
                    wally_free(puVar11);
                  }
                  else {
                    iVar8 = wally_witness_multisig_from_bytes
                                      (bytes_00,in_RSI,script,local_4b0 << 6,sighashes,local_4b0,0,
                                       local_478);
                    if ((iVar8 == 0) &&
                       ((local_460 == (uchar *)0x0 || (_Var7 = finalize_p2sh_wrapped(input), _Var7))
                       )) {
LAB_003dca86:
                      wally_clear_2(script,0x3c0,sighashes,0x3c);
                      goto LAB_003dc7ae;
                    }
                  }
                }
              }
            }
LAB_003dca57:
            wally_clear_2(script,0x3c0,sighashes,0x3c);
          }
          else if (type == 8) {
            if ((input->signatures).num_items == 1) {
              pwVar4 = (input->signatures).items;
              iVar8 = wally_witness_p2wpkh_from_der
                                (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,
                                 &input->final_witness);
              if ((iVar8 == 0) &&
                 ((input->redeem_script == (uchar *)0x0 ||
                  (_Var7 = finalize_p2sh_wrapped(input), _Var7)))) goto LAB_003dc7ae;
            }
          }
          else if ((type == 2) && ((input->signatures).num_items == 1)) {
            pwVar4 = (input->signatures).items;
            iVar8 = wally_scriptsig_p2pkh_from_der
                              (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,script,
                               0x8c,(size_t *)sighashes);
            if ((iVar8 == 0) &&
               (_Var7 = clone_bytes(&pwVar1[uVar12].final_scriptsig,script,sighashes._0_8_), _Var7))
            {
              input->final_scriptsig_len = sighashes._0_8_;
LAB_003dc7ae:
              clear_and_free(input->redeem_script,input->redeem_script_len);
              input->redeem_script = (uchar *)0x0;
              input->redeem_script_len = 0;
              clear_and_free(input->witness_script,input->witness_script_len);
              input->witness_script = (uchar *)0x0;
              input->witness_script_len = 0;
              wally_map_clear(&input->keypaths);
              wally_map_clear(&input->signatures);
              input->sighash = 0;
            }
          }
        }
      }
LAB_003dc6a5:
      uVar9 = psbt->num_inputs;
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int wally_psbt_finalize(struct wally_psbt *psbt)
{
    size_t i;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        return WALLY_EINVAL;

    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        const uint32_t utxo_index = psbt->tx->inputs[i].index;

        /* Script for this input. originally set to the input's scriptPubKey, but in the case of a p2sh/p2wsh
         * input, it will be eventually be set to the unhashed script, if known */
        unsigned char *out_script = NULL;
        size_t out_script_len, type;
        bool is_witness = false, is_p2sh = false;

        if (input->final_scriptsig || input->final_witness)
            continue; /* Already finalized */

        /* Note that if we patch libwally to supply the non-witness utxo tx field (tx) for
        * witness inputs also, we'll need a different way to signal p2sh-p2wpkh scripts */
        if (input->witness_utxo && input->witness_utxo->script_len > 0) {
            out_script = input->witness_utxo->script;
            out_script_len = input->witness_utxo->script_len;
            is_witness = true;
        } else if (input->utxo && utxo_index < input->utxo->num_outputs) {
            struct wally_tx_output *out = &input->utxo->outputs[utxo_index];
            out_script = out->script;
            out_script_len = out->script_len;
        }
        if (input->redeem_script) {
            out_script = input->redeem_script;
            out_script_len = input->redeem_script_len;
            is_p2sh = true;
        }
        if (input->witness_script) {
            out_script = input->witness_script;
            out_script_len = input->witness_script_len;
            is_witness = true;
        }

        if (!out_script)
            continue; /* We need an outscript to do anything */

        if (wally_scriptpubkey_get_type(out_script, out_script_len, &type) != WALLY_OK)
            continue; /* Can't identify the type, skip */

        switch(type) {
        case WALLY_SCRIPT_TYPE_P2PKH:
            if (!finalize_p2pkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_P2WPKH:
            if (!finalize_p2wpkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_MULTISIG:
            if (!finalize_multisig(input, out_script, out_script_len, is_witness, is_p2sh))
                continue;
            break;
        default:
            continue; /* Can't finalize this input, skip */
        }

        /* Clear non-final things */
        clear_and_free(input->redeem_script, input->redeem_script_len);
        input->redeem_script_len = 0;
        input->redeem_script = NULL;
        clear_and_free(input->witness_script, input->witness_script_len);
        input->witness_script_len = 0;
        input->witness_script = NULL;
        wally_map_clear(&input->keypaths);
        wally_map_clear(&input->signatures);
        input->sighash = 0;
    }
    return WALLY_OK;
}